

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

lexeme_t<cfgfile::string_trait_t> * __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme
          (lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  char cVar1;
  char_t cVar2;
  bool bVar3;
  pos_t pVar4;
  undefined8 uVar5;
  string_t *what;
  ulong uVar6;
  lexical_analyzer_t<cfgfile::string_trait_t> *in_RSI;
  lexeme_t<cfgfile::string_trait_t> *in_RDI;
  char_t next_char;
  char_t new_char;
  char_t ch;
  bool skip_comment;
  bool first_symbol;
  bool quoted_lexeme;
  string_t result;
  string *in_stack_fffffffffffff838;
  lexeme_type_t lVar7;
  string *this_00;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffff840;
  allocator *paVar8;
  input_stream_t<cfgfile::string_trait_t> *in_stack_fffffffffffff848;
  input_stream_t<cfgfile::string_trait_t> *in_stack_fffffffffffff850;
  exception_t<cfgfile::string_trait_t> *this_01;
  input_stream_t<cfgfile::string_trait_t> *in_stack_fffffffffffff858;
  undefined5 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff875;
  char_t in_stack_fffffffffffff876;
  undefined1 in_stack_fffffffffffff877;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  string local_6c8 [38];
  undefined1 local_6a2;
  allocator local_6a1;
  string local_6a0 [104];
  string local_638 [24];
  char_t *in_stack_fffffffffffff9e0;
  lexical_analyzer_t<cfgfile::string_trait_t> *in_stack_fffffffffffff9e8;
  allocator local_5f1;
  string local_5f0 [71];
  allocator local_5a9;
  string local_5a8 [229];
  char_t local_4c3;
  undefined1 local_4c2;
  allocator local_4c1;
  string local_4c0 [103];
  allocator local_459;
  string local_458 [71];
  allocator local_411;
  string local_410 [71];
  allocator local_3c9;
  string local_3c8 [231];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  allocator local_291;
  string local_290 [103];
  allocator local_229;
  string local_228 [71];
  allocator local_1e1;
  string local_1e0 [71];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [258];
  char local_6e;
  char_t local_6d;
  undefined4 local_6c;
  string local_68 [53];
  byte local_33;
  byte local_32;
  byte local_31;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  local_31 = 0;
  local_32 = 1;
  local_33 = 0;
  skip_spaces((lexical_analyzer_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff840);
  pVar4 = input_stream_t<cfgfile::string_trait_t>::line_number(in_RSI->m_stream);
  in_RSI->m_line_number = pVar4;
  pVar4 = input_stream_t<cfgfile::string_trait_t>::column_number(in_RSI->m_stream);
  in_RSI->m_column_number = pVar4;
  bVar3 = input_stream_t<cfgfile::string_trait_t>::at_end(in_stack_fffffffffffff848);
  if (bVar3) {
    std::__cxx11::string::string(local_68);
    lexeme_t<cfgfile::string_trait_t>::lexeme_t
              (in_stack_fffffffffffff840,(lexeme_type_t)((ulong)in_stack_fffffffffffff838 >> 0x20),
               (string_t *)0x1602a1);
    std::__cxx11::string::~string(local_68);
  }
  else {
    while( true ) {
      local_6d = input_stream_t<cfgfile::string_trait_t>::get(in_stack_fffffffffffff858);
      if (local_6d == const_t<cfgfile::string_trait_t>::c_quotes) {
        if ((local_31 & 1) != 0) goto LAB_00161852;
        if ((local_32 & 1) == 0) {
          input_stream_t<cfgfile::string_trait_t>::put_back
                    (in_stack_fffffffffffff850,(char_t)((ulong)in_stack_fffffffffffff848 >> 0x38));
          goto LAB_00161852;
        }
        local_31 = 1;
      }
      else if (local_6d == const_t<cfgfile::string_trait_t>::c_back_slash) {
        local_6e = '\0';
        if ((local_31 & 1) == 0) {
          std::__cxx11::string::push_back((char)local_30);
        }
        else {
          bVar3 = process_back_slash(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
          if (!bVar3) {
            local_292 = 1;
            uVar5 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_170,"Unrecognized back-slash sequence: \"\\",&local_171);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            cVar1 = local_6e;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,1,cVar1,&local_199);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e0,"\". In file \"",&local_1e1);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(in_RSI->m_stream);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff848,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff840);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_228,"\" on line ",&local_229);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            line_number(in_RSI);
            string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_290,".",&local_291);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            exception_t<cfgfile::string_trait_t>::exception_t
                      ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff850,
                       (string_t *)in_stack_fffffffffffff848);
            local_292 = 0;
            __cxa_throw(uVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                        exception_t<cfgfile::string_trait_t>::~exception_t);
          }
          std::__cxx11::string::push_back((char)local_30);
        }
      }
      else if (local_6d == const_t<cfgfile::string_trait_t>::c_begin_tag) {
        uVar6 = std::__cxx11::string::empty();
        cVar2 = local_6d;
        if ((uVar6 & 1) != 0) {
          std::allocator<char>::allocator();
          lVar7 = (lexeme_type_t)((ulong)in_stack_fffffffffffff838 >> 0x20);
          std::__cxx11::string::string(local_2b8,1,cVar2,&local_2b9);
          lexeme_t<cfgfile::string_trait_t>::lexeme_t
                    (in_stack_fffffffffffff840,lVar7,(string_t *)0x160a2c);
          std::__cxx11::string::~string(local_2b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          goto LAB_00161879;
        }
        if ((local_31 & 1) == 0) {
          input_stream_t<cfgfile::string_trait_t>::put_back
                    (in_stack_fffffffffffff850,(char_t)((ulong)in_stack_fffffffffffff848 >> 0x38));
          goto LAB_00161852;
        }
        std::__cxx11::string::push_back((char)local_30);
      }
      else if (local_6d == const_t<cfgfile::string_trait_t>::c_end_tag) {
        uVar6 = std::__cxx11::string::empty();
        cVar2 = local_6d;
        if ((uVar6 & 1) != 0) {
          std::allocator<char>::allocator();
          lVar7 = (lexeme_type_t)((ulong)in_stack_fffffffffffff838 >> 0x20);
          std::__cxx11::string::string(local_2e0,1,cVar2,&local_2e1);
          lexeme_t<cfgfile::string_trait_t>::lexeme_t
                    (in_stack_fffffffffffff840,lVar7,(string_t *)0x160b6c);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          goto LAB_00161879;
        }
        if ((local_31 & 1) == 0) {
          input_stream_t<cfgfile::string_trait_t>::put_back
                    (in_stack_fffffffffffff850,(char_t)((ulong)in_stack_fffffffffffff848 >> 0x38));
          goto LAB_00161852;
        }
        std::__cxx11::string::push_back((char)local_30);
      }
      else if ((local_6d == const_t<cfgfile::string_trait_t>::c_space) ||
              (local_6d == const_t<cfgfile::string_trait_t>::c_tab)) {
        if ((local_31 & 1) == 0) goto LAB_00161852;
        std::__cxx11::string::push_back((char)local_30);
      }
      else {
        if ((local_6d == const_t<cfgfile::string_trait_t>::c_carriage_return) ||
           (local_6d == const_t<cfgfile::string_trait_t>::c_line_feed)) {
          if ((local_31 & 1) != 0) {
            local_4c2 = 1;
            uVar5 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3c8,"Unfinished quoted lexeme. ",&local_3c9);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_410,"New line detected. In file \"",&local_411);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(in_RSI->m_stream);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff848,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff840);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_458,"\" on line ",&local_459);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            line_number(in_RSI);
            string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
            std::operator+(in_stack_fffffffffffff878,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff877,
                                    CONCAT16(in_stack_fffffffffffff876,
                                             CONCAT15(in_stack_fffffffffffff875,
                                                      in_stack_fffffffffffff870))));
            paVar8 = &local_4c1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4c0,".",paVar8);
            string_trait_t::from_ascii(in_stack_fffffffffffff838);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           paVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff877,
                                              CONCAT16(in_stack_fffffffffffff876,
                                                       CONCAT15(in_stack_fffffffffffff875,
                                                                in_stack_fffffffffffff870))));
            exception_t<cfgfile::string_trait_t>::exception_t
                      ((exception_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff850,
                       (string_t *)in_stack_fffffffffffff848);
            local_4c2 = 0;
            __cxa_throw(uVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                        exception_t<cfgfile::string_trait_t>::~exception_t);
          }
          goto LAB_00161852;
        }
        if (local_6d == const_t<cfgfile::string_trait_t>::c_vertical_bar) {
          if ((local_31 & 1) == 0) {
            in_stack_fffffffffffff877 =
                 input_stream_t<cfgfile::string_trait_t>::at_end(in_stack_fffffffffffff848);
            if ((bool)in_stack_fffffffffffff877) {
              std::__cxx11::string::push_back((char)local_30);
            }
            else {
              in_stack_fffffffffffff876 =
                   input_stream_t<cfgfile::string_trait_t>::get(in_stack_fffffffffffff858);
              local_4c3 = in_stack_fffffffffffff876;
              if (in_stack_fffffffffffff876 == const_t<cfgfile::string_trait_t>::c_vertical_bar) {
                local_33 = 1;
                skip_one_line_comment
                          ((lexical_analyzer_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff850)
                ;
                if ((local_32 & 1) == 0) goto LAB_00161852;
                skip_spaces((lexical_analyzer_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff840
                           );
              }
              else if (in_stack_fffffffffffff876 == const_t<cfgfile::string_trait_t>::c_sharp) {
                local_33 = 1;
                skip_multi_line_comment
                          ((lexical_analyzer_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff840)
                ;
                if ((local_32 & 1) == 0) goto LAB_00161852;
                skip_spaces((lexical_analyzer_t<cfgfile::string_trait_t> *)in_stack_fffffffffffff840
                           );
              }
              else {
                std::__cxx11::string::push_back((char)local_30);
                input_stream_t<cfgfile::string_trait_t>::put_back
                          (in_stack_fffffffffffff850,
                           (char_t)((ulong)in_stack_fffffffffffff848 >> 0x38));
              }
            }
          }
          else {
            std::__cxx11::string::push_back((char)local_30);
          }
        }
        else {
          std::__cxx11::string::push_back((char)local_30);
        }
      }
      in_stack_fffffffffffff875 =
           input_stream_t<cfgfile::string_trait_t>::at_end(in_stack_fffffffffffff848);
      if ((bool)in_stack_fffffffffffff875) break;
      if ((local_33 & 1) == 0) {
        local_32 = 0;
      }
      else {
        local_33 = 0;
      }
    }
    if ((local_31 & 1) != 0) {
      local_6a2 = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"Unfinished quoted lexeme. ",&local_5a9);
      string_trait_t::from_ascii(in_stack_fffffffffffff838);
      paVar8 = &local_5f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,"End of file riched. In file \"",paVar8);
      string_trait_t::from_ascii(in_stack_fffffffffffff838);
      std::operator+(in_stack_fffffffffffff878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,in_stack_fffffffffffff870)
                                      )));
      input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(in_RSI->m_stream);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff848,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff840);
      this_01 = (exception_t<cfgfile::string_trait_t> *)(local_6a0 + 0x67);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_638,"\" on line ",(allocator *)this_01);
      string_trait_t::from_ascii(in_stack_fffffffffffff838);
      std::operator+(in_stack_fffffffffffff878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,in_stack_fffffffffffff870)
                                      )));
      what = (string_t *)line_number(in_RSI);
      string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff838);
      std::operator+(in_stack_fffffffffffff878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,in_stack_fffffffffffff870)
                                      )));
      paVar8 = &local_6a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6a0,".",paVar8);
      string_trait_t::from_ascii(in_stack_fffffffffffff838);
      std::operator+(in_stack_fffffffffffff878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,in_stack_fffffffffffff870)
                                      )));
      exception_t<cfgfile::string_trait_t>::exception_t(this_01,what);
      local_6a2 = 0;
      __cxa_throw(uVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
LAB_00161852:
      lexeme_t<cfgfile::string_trait_t>::lexeme_t
                (in_stack_fffffffffffff840,(lexeme_type_t)((ulong)in_stack_fffffffffffff838 >> 0x20)
                 ,(string_t *)0x16186c);
    }
    else {
      this_00 = local_6c8;
      std::__cxx11::string::string(this_00);
      lexeme_t<cfgfile::string_trait_t>::lexeme_t
                (in_stack_fffffffffffff840,(lexeme_type_t)((ulong)this_00 >> 0x20),
                 (string_t *)0x1617f0);
      std::__cxx11::string::~string(local_6c8);
    }
  }
LAB_00161879:
  local_6c = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

lexeme_t< Trait > next_lexeme()
	{
		typename Trait::string_t result;

		bool quoted_lexeme = false;
		bool first_symbol = true;
		bool skip_comment = false;

		skip_spaces();

		m_line_number = m_stream.line_number();
		m_column_number = m_stream.column_number();

		if( m_stream.at_end() )
			return lexeme_t< Trait >( lexeme_type_t::null,
				typename Trait::string_t() );

		while( true )
		{
			typename Trait::char_t ch = m_stream.get();

			if( ch == const_t< Trait >::c_quotes )
			{
				if( quoted_lexeme )
					break;
				else if( first_symbol )
					quoted_lexeme = true;
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_back_slash )
			{
				typename Trait::char_t new_char( 0x00 );

				if( !quoted_lexeme )
					result.push_back( ch );
				else if( process_back_slash( new_char ) )
					result.push_back( new_char );
				else
					throw exception_t< Trait >(
						Trait::from_ascii( "Unrecognized back-slash "
							"sequence: \"\\" ) +
						typename Trait::string_t( 1, new_char ) +
						Trait::from_ascii( "\". In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
			}
			else if( ch == const_t< Trait >::c_begin_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::start,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_end_tag )
			{
				if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::finish,
						typename Trait::string_t( 1, ch ) );
				else if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					m_stream.put_back( ch );

					break;
				}
			}
			else if( ch == const_t< Trait >::c_space ||
				ch == const_t< Trait >::c_tab )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_carriage_return ||
				ch == const_t< Trait >::c_line_feed )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "New line detected. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else
					break;
			}
			else if( ch == const_t< Trait >::c_vertical_bar )
			{
				if( quoted_lexeme )
					result.push_back( ch );
				else
				{
					if( !m_stream.at_end() )
					{
						typename Trait::char_t next_char = m_stream.get();

						if( next_char == const_t< Trait >::c_vertical_bar )
						{
							skip_comment = true;

							skip_one_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else if( next_char == const_t< Trait >::c_sharp )
						{
							skip_comment = true;

							skip_multi_line_comment();

							if( first_symbol )
								skip_spaces();
							else
								break;
						}
						else
						{
							result.push_back( ch );

							m_stream.put_back( next_char );
						}
					}
					else
						result.push_back( ch );
				}
			}
			else
				result.push_back( ch );

			if( m_stream.at_end() )
			{
				if( quoted_lexeme )
					throw exception_t< Trait >(
						Trait::from_ascii( "Unfinished quoted lexeme. " ) +
						Trait::from_ascii( "End of file riched. In file \"" ) +
						m_stream.file_name() +
						Trait::from_ascii( "\" on line " ) +
						Trait::to_string( line_number() ) +
						Trait::from_ascii( "." ) );
				else if( result.empty() )
					return lexeme_t< Trait >( lexeme_type_t::null,
						typename Trait::string_t() );
				else
					break;
			}

			if( !skip_comment )
				first_symbol = false;
			else
				skip_comment = false;
		}

		return lexeme_t< Trait >( lexeme_type_t::string, result );
	}